

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetTXTransformf(ndicapi *pol,int portHandle,float *transform)

{
  char (*cp) [52];
  long lVar1;
  int local_34;
  int n;
  int i;
  char *readPointer;
  float *transform_local;
  int portHandle_local;
  ndicapi *pol_local;
  
  local_34 = 0;
  while ((local_34 < pol->TxHandleCount && ((uint)pol->TxHandles[local_34] != portHandle))) {
    local_34 = local_34 + 1;
  }
  if (local_34 == pol->TxHandleCount) {
    pol_local._4_4_ = 1;
  }
  else {
    cp = pol->TxTransforms + local_34;
    if (((*cp)[0] == 'D') || ((*cp)[0] == '\0')) {
      pol_local._4_4_ = 1;
    }
    else if ((*cp)[0] == 'M') {
      pol_local._4_4_ = 2;
    }
    else {
      lVar1 = ndiSignedToLong(*cp,6);
      *transform = (float)lVar1 * 0.0001;
      lVar1 = ndiSignedToLong(*cp + 6,6);
      transform[1] = (float)lVar1 * 0.0001;
      lVar1 = ndiSignedToLong(*cp + 0xc,6);
      transform[2] = (float)lVar1 * 0.0001;
      lVar1 = ndiSignedToLong(*cp + 0x12,6);
      transform[3] = (float)lVar1 * 0.0001;
      lVar1 = ndiSignedToLong(*cp + 0x18,7);
      transform[4] = (float)lVar1 * 0.01;
      lVar1 = ndiSignedToLong(*cp + 0x1f,7);
      transform[5] = (float)lVar1 * 0.01;
      lVar1 = ndiSignedToLong(*cp + 0x26,7);
      transform[6] = (float)lVar1 * 0.01;
      lVar1 = ndiSignedToLong(*cp + 0x2d,6);
      transform[7] = (float)lVar1 * 0.0001;
      pol_local._4_4_ = 0;
    }
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetTXTransformf(ndicapi* pol, int portHandle, float transform[8])
{
  char* readPointer;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  readPointer = pol->TxTransforms[i];
  if (*readPointer == 'D' || *readPointer == '\0')
  {
    return NDI_DISABLED;
  }
  else if (*readPointer == 'M')
  {
    return NDI_MISSING;
  }

  transform[0] = ndiSignedToLong(&readPointer[0],  6) * 0.0001f;
  transform[1] = ndiSignedToLong(&readPointer[6],  6) * 0.0001f;
  transform[2] = ndiSignedToLong(&readPointer[12], 6) * 0.0001f;
  transform[3] = ndiSignedToLong(&readPointer[18], 6) * 0.0001f;
  transform[4] = ndiSignedToLong(&readPointer[24], 7) * 0.01f;
  transform[5] = ndiSignedToLong(&readPointer[31], 7) * 0.01f;
  transform[6] = ndiSignedToLong(&readPointer[38], 7) * 0.01f;
  transform[7] = ndiSignedToLong(&readPointer[45], 6) * 0.0001f;

  return NDI_OKAY;
}